

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O0

void predict(ect *e,single_learner *base,example *ec)

{
  ulong uVar1;
  uint32_t uVar2;
  ostream *poVar3;
  long in_RDX;
  example *in_RDI;
  single_learner *unaff_retaddr;
  label_t mc;
  uint local_20;
  
  uVar1 = *(ulong *)(in_RDX + 0x6828);
  local_20 = (uint)uVar1;
  if ((local_20 == 0) ||
     (((in_RDI->super_example_predict).indices._begin < (uchar *)(uVar1 & 0xffffffff) &&
      (local_20 != 0xffffffff)))) {
    poVar3 = std::operator<<((ostream *)&std::cout,"label ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
    poVar3 = std::operator<<(poVar3," is not in {1,");
    poVar3 = (ostream *)
             std::ostream::operator<<(poVar3,(ulong)(in_RDI->super_example_predict).indices._begin);
    poVar3 = std::operator<<(poVar3,"} This won\'t work right.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  uVar2 = ect_predict((ect *)mc,unaff_retaddr,in_RDI);
  *(uint32_t *)(in_RDX + 0x6850) = uVar2;
  *(ulong *)(in_RDX + 0x6828) = uVar1;
  return;
}

Assistant:

void predict(ect& e, single_learner& base, example& ec)
{
  MULTICLASS::label_t mc = ec.l.multi;
  if (mc.label == 0 || (mc.label > e.k && mc.label != (uint32_t)-1))
    cout << "label " << mc.label << " is not in {1," << e.k << "} This won't work right." << endl;
  ec.pred.multiclass = ect_predict(e, base, ec);
  ec.l.multi = mc;
}